

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serv.cpp
# Opt level: O3

UnicodeString * __thiscall
icu_63::ICUService::getDisplayName
          (ICUService *this,UnicodeString *id,UnicodeString *result,Locale *locale)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  Hashtable *pHVar4;
  long *plVar5;
  undefined4 extraout_var;
  long *plVar6;
  UErrorCode status;
  UnicodeString us;
  UErrorCode local_84;
  UnicodeString *local_80;
  Locale *local_78;
  UnicodeString local_70;
  
  local_84 = U_ZERO_ERROR;
  umtx_lock_63((UMutex *)lock);
  pHVar4 = getVisibleIDMap(this,&local_84);
  bVar1 = true;
  if (pHVar4 != (Hashtable *)0x0) {
    plVar5 = (long *)uhash_get_63(pHVar4->hash,id);
    if (plVar5 == (long *)0x0) {
      local_84 = U_ZERO_ERROR;
      iVar3 = (*(this->super_ICUNotifier)._vptr_ICUNotifier[0xd])(this,id);
      plVar5 = (long *)CONCAT44(extraout_var,iVar3);
      if (plVar5 != (long *)0x0) {
        local_80 = result;
        local_78 = locale;
        while( true ) {
          cVar2 = (**(code **)(*plVar5 + 0x38))(plVar5);
          if (cVar2 == '\0') break;
          local_70.super_Replaceable.super_UObject._vptr_UObject =
               (UObject)&PTR__UnicodeString_003f5be0;
          local_70.fUnion.fStackFields.fLengthAndFlags = 2;
          (**(code **)(*plVar5 + 0x28))(plVar5,&local_70);
          plVar6 = (long *)uhash_get_63(pHVar4->hash,&local_70);
          result = local_80;
          if (plVar6 != (long *)0x0) {
            (**(code **)(*plVar6 + 0x28))(plVar6,id,local_78,local_80);
            (**(code **)(*plVar5 + 8))(plVar5);
            UnicodeString::~UnicodeString(&local_70);
            goto LAB_002af8bf;
          }
          UnicodeString::~UnicodeString(&local_70);
        }
        (**(code **)(*plVar5 + 8))(plVar5);
        result = local_80;
      }
    }
    else {
      (**(code **)(*plVar5 + 0x28))(plVar5,id,locale,result);
LAB_002af8bf:
      bVar1 = false;
    }
  }
  umtx_unlock_63((UMutex *)lock);
  if (bVar1) {
    UnicodeString::setToBogus(result);
  }
  return result;
}

Assistant:

UnicodeString& 
ICUService::getDisplayName(const UnicodeString& id, UnicodeString& result, const Locale& locale) const 
{
    {
        UErrorCode status = U_ZERO_ERROR;
        Mutex mutex(&lock);
        const Hashtable* map = getVisibleIDMap(status);
        if (map != NULL) {
            ICUServiceFactory* f = (ICUServiceFactory*)map->get(id);
            if (f != NULL) {
                f->getDisplayName(id, locale, result);
                return result;
            }

            // fallback
            status = U_ZERO_ERROR;
            ICUServiceKey* fallbackKey = createKey(&id, status);
            while (fallbackKey != NULL && fallbackKey->fallback()) {
                UnicodeString us;
                fallbackKey->currentID(us);
                f = (ICUServiceFactory*)map->get(us);
                if (f != NULL) {
                    f->getDisplayName(id, locale, result);
                    delete fallbackKey;
                    return result;
                }
            }
            delete fallbackKey;
        }
    }
    result.setToBogus();
    return result;
}